

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

SampledSpectrum pbrt::SafeDiv(SampledSpectrum *s1,SampledSpectrum *s2)

{
  float fVar1;
  array<float,_4> aVar2;
  int i;
  long lVar3;
  float fVar4;
  SampledSpectrum r;
  
  r.values.values[0] = 0.0;
  r.values.values[1] = 0.0;
  r.values.values[2] = 0.0;
  r.values.values[3] = 0.0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    fVar1 = (s2->values).values[lVar3];
    fVar4 = 0.0;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      fVar4 = (s1->values).values[lVar3] / fVar1;
    }
    r.values.values[lVar3] = fVar4;
  }
  aVar2.values[2] = r.values.values[2];
  aVar2.values[3] = r.values.values[3];
  aVar2.values[0] = r.values.values[0];
  aVar2.values[1] = r.values.values[1];
  return (array<float,_4>)(array<float,_4>)aVar2.values;
}

Assistant:

array() = default;